

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O2

void utrie_compact(UNewTrie *trie,UBool overlap,UErrorCode *pErrorCode)

{
  int32_t *__s;
  char cVar1;
  uint32_t *puVar2;
  UBool UVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint32_t *puVar13;
  long lVar14;
  uint uVar15;
  
  if ((U_ZERO_ERROR < *pErrorCode) || (trie->isCompacted != '\0')) {
    return;
  }
  __s = trie->map;
  memset(__s,0xff,0x22084);
  uVar9 = 0;
  uVar6 = (ulong)(uint)trie->indexLength;
  if (trie->indexLength < 1) {
    uVar6 = uVar9;
  }
  for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
    uVar12 = trie->index[uVar9];
    uVar15 = -uVar12;
    if (0 < (int)uVar12) {
      uVar15 = uVar12;
    }
    trie->map[uVar15 >> 5] = 0;
  }
  trie->map[0] = 0;
  cVar1 = trie->isLatin1Linear;
  lVar7 = 4;
  if (overlap == '\0') {
    lVar7 = 0x20;
  }
  uVar6 = 0x20;
  uVar12 = 0x20;
LAB_00110bba:
  uVar15 = (int)uVar6 + 0x1c;
  lVar11 = (long)(int)uVar6 << 2;
  do {
    iVar8 = (int)uVar6;
    if (trie->dataLength <= iVar8) {
      for (lVar7 = 0; lVar7 < trie->indexLength; lVar7 = lVar7 + 1) {
        uVar15 = trie->index[lVar7];
        uVar10 = -uVar15;
        if (0 < (int)uVar15) {
          uVar10 = uVar15;
        }
        trie->index[lVar7] = trie->map[uVar10 >> 5];
      }
      trie->dataLength = uVar12;
      return;
    }
    iVar4 = iVar8 >> 5;
    if (-1 < __s[iVar4]) {
      if (iVar8 < (int)((uint)(cVar1 != '\0') << 8 | 0x20)) goto LAB_00110cdb;
      puVar2 = trie->data;
      lVar14 = 0;
      puVar13 = puVar2;
      while( true ) {
        if ((int)(uVar12 - 0x20) < lVar14) {
          if (overlap == '\0') goto LAB_00110cdb;
          puVar13 = puVar2 + (long)(int)uVar12 + -0x1c;
          lVar14 = 0;
          goto LAB_00110cb1;
        }
        UVar3 = equal_uint32(puVar13,puVar2 + uVar6,0x20);
        if (UVar3 != '\0') break;
        lVar14 = lVar14 + lVar7;
        puVar13 = (uint32_t *)((long)puVar13 + (ulong)(uint)((int)lVar7 * 4));
      }
      __s[iVar4] = (int32_t)lVar14;
    }
    uVar6 = (ulong)(iVar8 + 0x20);
    uVar15 = uVar15 + 0x20;
    lVar11 = lVar11 + 0x80;
  } while( true );
LAB_00110cb1:
  if (lVar14 == -0x1c) goto LAB_00110cdb;
  iVar5 = (int)lVar14;
  UVar3 = equal_uint32(puVar13,puVar2 + uVar6,iVar5 + 0x1c);
  if (UVar3 == '\0') {
    lVar14 = lVar14 + -4;
    puVar13 = puVar13 + 4;
    uVar15 = uVar15 - 4;
    goto LAB_00110cb1;
  }
  __s[iVar4] = (uVar12 - iVar5) + -0x1c;
  lVar11 = (long)(int)uVar15;
  lVar14 = 0;
  for (iVar5 = 4 - iVar5; uVar6 = (ulong)uVar15, 0 < iVar5; iVar5 = iVar5 + -1) {
    puVar2[(int)uVar12 + lVar14] = puVar2[lVar11 + lVar14];
    lVar14 = lVar14 + 1;
    uVar15 = uVar15 + 1;
  }
  uVar12 = uVar12 + (int)lVar14;
  goto LAB_00110bba;
LAB_00110cdb:
  if ((int)uVar12 < iVar8) {
    trie->map[iVar4] = uVar12;
    puVar2 = trie->data;
    iVar4 = 0;
    for (lVar14 = 0; (int)lVar14 != 0x20; lVar14 = lVar14 + 1) {
      puVar2[(int)uVar12 + lVar14] = *(uint32_t *)((long)puVar2 + lVar14 * 4 + lVar11);
      iVar4 = iVar4 + -1;
    }
    uVar12 = uVar12 - iVar4;
    uVar6 = (ulong)(uint)(iVar8 - iVar4);
  }
  else {
    __s[iVar4] = iVar8;
    uVar12 = uVar12 + 0x20;
    uVar6 = (ulong)uVar12;
  }
  goto LAB_00110bba;
}

Assistant:

static void
utrie_compact(UNewTrie *trie, UBool overlap, UErrorCode *pErrorCode) {
    int32_t i, start, newStart, overlapStart;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return;
    }

    /* valid, uncompacted trie? */
    if(trie==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    if(trie->isCompacted) {
        return; /* nothing left to do */
    }

    /* compaction */

    /* initialize the index map with "block is used/unused" flags */
    _findUnusedBlocks(trie);

    /* if Latin-1 is preallocated and linear, then do not compact Latin-1 data */
    if(trie->isLatin1Linear && UTRIE_SHIFT<=8) {
        overlapStart=UTRIE_DATA_BLOCK_LENGTH+256;
    } else {
        overlapStart=UTRIE_DATA_BLOCK_LENGTH;
    }

    newStart=UTRIE_DATA_BLOCK_LENGTH;
    for(start=newStart; start<trie->dataLength;) {
        /*
         * start: index of first entry of current block
         * newStart: index where the current block is to be moved
         *           (right after current end of already-compacted data)
         */

        /* skip blocks that are not used */
        if(trie->map[start>>UTRIE_SHIFT]<0) {
            /* advance start to the next block */
            start+=UTRIE_DATA_BLOCK_LENGTH;

            /* leave newStart with the previous block! */
            continue;
        }

        /* search for an identical block */
        if( start>=overlapStart &&
            (i=_findSameDataBlock(trie->data, newStart, start,
                            overlap ? UTRIE_DATA_GRANULARITY : UTRIE_DATA_BLOCK_LENGTH))
             >=0
        ) {
            /* found an identical block, set the other block's index value for the current block */
            trie->map[start>>UTRIE_SHIFT]=i;

            /* advance start to the next block */
            start+=UTRIE_DATA_BLOCK_LENGTH;

            /* leave newStart with the previous block! */
            continue;
        }

        /* see if the beginning of this block can be overlapped with the end of the previous block */
        if(overlap && start>=overlapStart) {
            /* look for maximum overlap (modulo granularity) with the previous, adjacent block */
            for(i=UTRIE_DATA_BLOCK_LENGTH-UTRIE_DATA_GRANULARITY;
                i>0 && !equal_uint32(trie->data+(newStart-i), trie->data+start, i);
                i-=UTRIE_DATA_GRANULARITY) {}
        } else {
            i=0;
        }

        if(i>0) {
            /* some overlap */
            trie->map[start>>UTRIE_SHIFT]=newStart-i;

            /* move the non-overlapping indexes to their new positions */
            start+=i;
            for(i=UTRIE_DATA_BLOCK_LENGTH-i; i>0; --i) {
                trie->data[newStart++]=trie->data[start++];
            }
        } else if(newStart<start) {
            /* no overlap, just move the indexes to their new positions */
            trie->map[start>>UTRIE_SHIFT]=newStart;
            for(i=UTRIE_DATA_BLOCK_LENGTH; i>0; --i) {
                trie->data[newStart++]=trie->data[start++];
            }
        } else /* no overlap && newStart==start */ {
            trie->map[start>>UTRIE_SHIFT]=start;
            newStart+=UTRIE_DATA_BLOCK_LENGTH;
            start=newStart;
        }
    }

    /* now adjust the index (stage 1) table */
    for(i=0; i<trie->indexLength; ++i) {
        trie->index[i]=trie->map[ABS(trie->index[i])>>UTRIE_SHIFT];
    }

#ifdef UTRIE_DEBUG
    /* we saved some space */
    printf("compacting trie: count of 32-bit words %lu->%lu\n",
            (long)trie->dataLength, (long)newStart);
#endif

    trie->dataLength=newStart;
}